

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int16Type.cpp
# Opt level: O2

void __thiscall hdc::Int16Type::Int16Type(Int16Type *this,Token *token)

{
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_0019a980;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_INT16_TYPE;
  return;
}

Assistant:

Int16Type::Int16Type(Token& token) {
    this->token = token;
    this->kind = AST_INT16_TYPE;
}